

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

int scanPastString(char *buffer,int buffer_len,int offset,int *lines)

{
  char *needle;
  char cVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  int needle_len;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  int local_40;
  int matchlen;
  long local_38;
  
  uVar11 = (ulong)(uint)offset;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (offset < 1) {
    cVar3 = buffer[offset];
  }
  else {
    cVar3 = buffer[uVar11];
    if (cVar3 == '\"') {
      bVar7 = false;
      bVar8 = false;
      bVar2 = false;
      for (uVar4 = offset - 1; -1 < (int)uVar4; uVar4 = uVar4 + iVar5) {
        if (uVar4 == 0) {
LAB_0016ac52:
          bVar9 = 0;
LAB_0016ac55:
          iVar5 = -1;
          if (bVar8) {
            if (buffer[uVar4] != 'u') {
LAB_0016ad39:
              if (bVar2) {
                cVar3 = buffer[uVar4];
                iVar5 = isalnum((int)cVar3);
                if (iVar5 != 0) {
                  bVar2 = false;
                }
                if (cVar3 == 0x5f) {
                  bVar2 = false;
                }
              }
              break;
            }
            bVar7 = true;
            bVar8 = false;
          }
          else {
            if (bVar7) goto LAB_0016ad39;
            cVar3 = buffer[uVar4];
            if ((bool)(bVar9 & cVar3 == '8')) {
              bVar8 = true;
              bVar7 = false;
            }
            else {
              bVar7 = true;
              bVar8 = false;
              if (((cVar3 != 'L') && (cVar3 != 'u')) && (cVar3 != 'U')) {
                if ((cVar3 != 'R') || (bVar2)) goto LAB_0016ad39;
                bVar2 = true;
                bVar7 = false;
                bVar8 = false;
              }
            }
          }
        }
        else {
          cVar3 = buffer[uVar4];
          if (((cVar3 != '\r') && (cVar3 != '\n')) || (buffer[(ulong)uVar4 - 1] != '\\')) {
            if (uVar4 == 1) goto LAB_0016ac52;
            bVar9 = 1;
            if (((cVar3 == '\n') && (buffer[(ulong)uVar4 - 1] == '\r')) &&
               (buffer[(ulong)uVar4 - 2] == '\\')) {
              iVar5 = -3;
              goto LAB_0016ac91;
            }
            goto LAB_0016ac55;
          }
          iVar5 = -2;
        }
LAB_0016ac91:
      }
      cVar3 = '\"';
      if (bVar2) {
        iVar5 = skipEscapedLineEnds(buffer,buffer_len,offset + 1,lines);
        lVar10 = (long)iVar5;
        needle = buffer + lVar10;
        needle_len = 0;
        while (matchlen = needle_len, iVar5 < buffer_len) {
          if (buffer[iVar5] == '(') break;
          if (lVar10 < iVar5) {
            buffer[lVar10] = buffer[iVar5];
          }
          lVar10 = lVar10 + 1;
          iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,lines);
          needle_len = needle_len + 1;
        }
LAB_0016add0:
        do {
          local_40 = 0;
          iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,lines);
          if (buffer_len <= iVar5) {
            uVar4 = matchlen + iVar5 + 1;
            iVar6 = 0;
            break;
          }
          cVar3 = buffer[iVar5];
          if ((cVar3 == '\n') || (cVar3 == '\r')) {
            *lines = *lines + 1;
            goto LAB_0016add0;
          }
        } while ((cVar3 != ')') ||
                (((0 < needle_len &&
                  (bVar2 = matchWhileUnsplitting
                                     (buffer,buffer_len,iVar5 + 1,needle,needle_len,&matchlen,
                                      &local_40), !bVar2)) ||
                 (uVar4 = iVar5 + 1 + matchlen, iVar6 = local_40, buffer[(int)uVar4] != '\"'))));
        uVar11 = (ulong)uVar4;
        *lines = *lines + iVar6;
        goto LAB_0016aea3;
      }
    }
    else if (((0xfffffff5 < (byte)buffer[uVar11 - 1] - 0x3a) && ((int)(uVar11 + 1) < buffer_len)) &&
            (0xfffffff5 < (byte)buffer[uVar11 + 1] - 0x3a)) {
      if (offset == 1) {
        uVar11 = 1;
        goto LAB_0016aea3;
      }
      if ((buffer[uVar11 - 1] != 0x38) || (buffer[uVar11 - 2] != 'u')) goto LAB_0016aea3;
    }
  }
  while( true ) {
    iVar5 = (int)uVar11;
    uVar11 = (long)iVar5 + 1;
    if ((buffer_len <= (int)uVar11) || (cVar1 = buffer[uVar11], cVar1 == cVar3)) break;
    if ((cVar1 == '\n') || (cVar1 == '\r')) {
      *lines = *lines + 1;
    }
    else if (cVar1 == '\\') {
      uVar11 = (ulong)(iVar5 + 2);
    }
  }
LAB_0016aea3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)uVar11;
}

Assistant:

static int scanPastString(char *buffer, int buffer_len, int offset, int *lines)
{
    // http://en.cppreference.com/w/cpp/language/string_literal
    // It might be a C++11 raw string.
    bool israw = false;

    Q_ASSERT(offset < buffer_len);
    if (offset <= 0) {
        // skip, neither of these special cases applies here
    } else if (buffer[offset] == '"') {
        int explore = offset - 1;
        bool prefix = false; // One of L, U, u or u8 may appear before R
        bool saw8 = false; // Partial scan of u8
        while (explore >= 0) {
            // Cope with backslash-newline interruptions of the prefix:
            if (explore > 0
                && qmake_endOfLine(buffer[explore])
                && buffer[explore - 1] == '\\') {
                explore -= 2;
            } else if (explore > 1
                       && buffer[explore] == '\n'
                       && buffer[explore - 1] == '\r'
                       && buffer[explore - 2] == '\\') {
                explore -= 3;
                // Remaining cases can only decrement explore by one at a time:
            } else if (saw8 && buffer[explore] == 'u') {
                explore--;
                saw8 = false;
                prefix = true;
            } else if (saw8 || prefix) {
                break;
            } else if (explore > 1 && buffer[explore] == '8') {
                explore--;
                saw8 = true;
            } else if (buffer[explore] == 'L'
                       || buffer[explore] == 'U'
                       || buffer[explore] == 'u') {
                explore--;
                prefix = true;
            } else if (buffer[explore] == 'R') {
                if (israw)
                    break;
                explore--;
                israw = true;
            } else {
                break;
            }
        }
        // Check the R (with possible prefix) isn't just part of an identifier:
        if (israw && explore >= 0
            && (isalnum(buffer[explore]) || buffer[explore] == '_')) {
            israw = false;
        }

    } else {
        // Is this apostrophe a digit separator rather than the start of a
        // character literal ? If so, there was no string to scan past, so
        // treat the apostrophe as both open and close.
        Q_ASSERT(buffer[offset] == '\'' && offset > 0);
        // Wrap std::isdigit() to package the casting to unsigned char.
        const auto isDigit = [](unsigned char c) { return std::isdigit(c); };
        if (isDigit(buffer[offset - 1]) && offset + 1 < buffer_len && isDigit(buffer[offset + 1])) {
            // One exception: u8'0' is a perfectly good character literal.
            if (offset < 2 || buffer[offset - 1] != '8' || buffer[offset - 2] != 'u')
                return offset;
        }
    }

    if (israw) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), lines)

        offset = SKIP_BSNL(offset + 1);
        const char *const delim = buffer + offset;
        int clean = offset;
        while (offset < buffer_len && buffer[offset] != '(') {
            if (clean < offset)
                buffer[clean++] = buffer[offset];
            else
                clean++;

            offset = SKIP_BSNL(offset + 1);
        }
        /*
          Not checking correctness (trust real compiler to do that):
          - no controls, spaces, '(', ')', '\\' or (presumably) '"' in delim;
          - at most 16 bytes in delim

          Raw strings are surely defined after phase 2, when BSNLs are resolved;
          so the delimiter's exclusion of '\\' and space (including newlines)
          applies too late to save us the need to cope with BSNLs in it.
        */

        const int delimlen = buffer + clean - delim;
        int matchlen = delimlen, extralines = 0;
        while ((offset = SKIP_BSNL(offset + 1)) < buffer_len
               && (buffer[offset] != ')'
                   || (delimlen > 0 &&
                       !matchWhileUnsplitting(buffer, buffer_len,
                                              offset + 1, delim, delimlen,
                                              &matchlen, &extralines))
                   || buffer[offset + 1 + matchlen] != '"')) {
            // skip, but keep track of lines
            if (qmake_endOfLine(buffer[offset]))
                ++*lines;
            extralines = 0;
        }
        *lines += extralines; // from the match
        // buffer[offset] is ')'
        offset += 1 + matchlen; // 1 for ')', then delim
        // buffer[offset] is '"'

#undef SKIP_BSNL
    } else { // Traditional string or char literal:
        const char term = buffer[offset];
        while (++offset < buffer_len && buffer[offset] != term) {
            if (buffer[offset] == '\\')
                ++offset;
            else if (qmake_endOfLine(buffer[offset]))
                ++*lines;
        }
    }

    return offset;
}